

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamStandardIndex::WriteAlignmentChunk
          (BamStandardIndex *this,BaiAlignmentChunk *chunk)

{
  IBamIODevice *pIVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BamException *this_00;
  uint64_t stop;
  uint64_t start;
  ulong local_78;
  ulong local_70;
  string local_68;
  string local_48;
  
  local_70 = chunk->Start;
  local_78 = chunk->Stop;
  if (this->m_isBigEndian == true) {
    local_70 = local_70 >> 0x38 | (local_70 & 0xff000000000000) >> 0x28 |
               (local_70 & 0xff0000000000) >> 0x18 | (local_70 & 0xff00000000) >> 8 |
               (local_70 & 0xff000000) << 8 | (local_70 & 0xff0000) << 0x18 |
               (local_70 & 0xff00) << 0x28 | local_70 << 0x38;
    local_78 = local_78 >> 0x38 | (local_78 & 0xff000000000000) >> 0x28 |
               (local_78 & 0xff0000000000) >> 0x18 | (local_78 & 0xff00000000) >> 8 |
               (local_78 & 0xff000000) << 8 | (local_78 & 0xff0000) << 0x18 |
               (local_78 & 0xff00) << 0x28 | local_78 << 0x38;
  }
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&local_70,8);
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&local_78,8);
  if (CONCAT44(extraout_var_00,iVar3) + CONCAT44(extraout_var,iVar2) == 0x10) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"BamStandardIndex::WriteAlignmentChunk","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"could not write BAI alignment chunk","");
  BamException::BamException(this_00,&local_48,&local_68);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::WriteAlignmentChunk(const BaiAlignmentChunk& chunk)
{

    // localize alignment chunk offsets
    uint64_t start = chunk.Start;
    uint64_t stop = chunk.Stop;

    // swap endian-ness if necessary
    if (m_isBigEndian) {
        SwapEndian_64(start);
        SwapEndian_64(stop);
    }

    // write to index file
    int64_t numBytesWritten = 0;
    numBytesWritten += m_resources.Device->Write((const char*)&start, sizeof(start));
    numBytesWritten += m_resources.Device->Write((const char*)&stop, sizeof(stop));
    if (numBytesWritten != (sizeof(start) + sizeof(stop)))
        throw BamException("BamStandardIndex::WriteAlignmentChunk",
                           "could not write BAI alignment chunk");
}